

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber * uprv_decNumberAbs_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint32_t status;
  uint32_t local_28;
  decNumber local_24;
  
  local_28 = 0;
  local_24.bits = '\0';
  local_24.lsu[0] = '\0';
  local_24.digits = 1;
  local_24.exponent = rhs->exponent;
  decAddOp(res,&local_24,rhs,set,rhs->bits & 0x80,&local_28);
  if (local_28 != 0) {
    decStatus(res,local_28,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberAbs(decNumber *res, const decNumber *rhs,
                         decContext *set) {
  decNumber dzero;                      /* for 0  */
  uInt status=0;                        /* accumulator  */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  uprv_decNumberZero(&dzero);                /* set 0  */
  dzero.exponent=rhs->exponent;         /* [no coefficient expansion]  */
  decAddOp(res, &dzero, rhs, set, (uByte)(rhs->bits & DECNEG), &status);
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }